

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  Mat *this_00;
  undefined4 *puVar1;
  uint _h;
  void *pvVar2;
  size_t sVar3;
  int *piVar4;
  Allocator *pAVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  int iVar22;
  uint _w;
  int iVar23;
  Layer *pLVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined4 *puVar36;
  undefined4 *puVar37;
  long lVar38;
  ParamDict pd;
  long local_c0;
  Mat local_78;
  
  pLVar24 = create_layer_cpu(0xe);
  this->flatten = pLVar24;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    _h = (this->super_InnerProduct).num_output;
    iVar23 = (this->super_InnerProduct).weight_data_size;
    _w = iVar23 / (int)_h;
    this_00 = &(this->super_InnerProduct).weight_data;
    if (((_h & 3) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&local_78,this_00,_w,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,_w,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        lVar28 = 1;
        lVar30 = 2;
        local_c0 = 3;
        lVar34 = 0;
        uVar31 = 0;
        do {
          lVar27 = (long)(this->weight_data_tm).w;
          pvVar2 = (this->weight_data_tm).data;
          sVar3 = (this->weight_data_tm).elemsize;
          puVar36 = (undefined4 *)((uVar31 >> 2) * lVar27 * sVar3 + (long)pvVar2);
          lVar25 = (long)local_78.w;
          if ((int)_w < 4) {
            lVar25 = local_78.elemsize * lVar25;
            lVar38 = lVar25 * uVar31;
            lVar35 = (uVar31 | 1) * lVar25;
            lVar33 = (uVar31 | 2) * lVar25;
            lVar25 = lVar25 * (uVar31 | 3);
            uVar26 = 0;
          }
          else {
            lVar38 = local_78.elemsize * uVar31 * lVar25;
            lVar35 = local_78.elemsize * lVar28 * lVar25;
            lVar33 = local_78.elemsize * lVar30 * lVar25;
            lVar25 = local_78.elemsize * local_c0 * lVar25;
            iVar23 = 3;
            lVar29 = 0;
            do {
              puVar37 = puVar36;
              puVar1 = (undefined4 *)((long)local_78.data + lVar29 + lVar38);
              uVar6 = puVar1[1];
              uVar7 = puVar1[2];
              uVar8 = puVar1[3];
              puVar36 = (undefined4 *)((long)local_78.data + lVar29 + lVar35);
              uVar9 = *puVar36;
              uVar10 = puVar36[1];
              uVar11 = puVar36[2];
              uVar12 = puVar36[3];
              puVar36 = (undefined4 *)((long)local_78.data + lVar29 + lVar33);
              uVar13 = *puVar36;
              uVar14 = puVar36[1];
              uVar15 = puVar36[2];
              uVar16 = puVar36[3];
              puVar36 = (undefined4 *)((long)local_78.data + lVar29 + lVar25);
              uVar17 = *puVar36;
              uVar18 = puVar36[1];
              uVar19 = puVar36[2];
              uVar20 = puVar36[3];
              puVar36 = (undefined4 *)((long)pvVar2 + lVar29 * 4 + sVar3 * lVar34 * lVar27 + 0x40);
              puVar36[-0x10] = *puVar1;
              puVar36[-0xf] = uVar9;
              puVar36[-0xe] = uVar13;
              puVar36[-0xd] = uVar17;
              puVar36[-0xc] = uVar6;
              puVar36[-0xb] = uVar10;
              puVar36[-10] = uVar14;
              puVar36[-9] = uVar18;
              puVar36[-8] = uVar7;
              puVar36[-7] = uVar11;
              puVar36[-6] = uVar15;
              puVar36[-5] = uVar19;
              puVar36[-4] = uVar8;
              puVar36[-3] = uVar12;
              puVar36[-2] = uVar16;
              puVar36[-1] = uVar20;
              lVar29 = lVar29 + 0x10;
              iVar23 = iVar23 + 4;
            } while (iVar23 < (int)_w);
            puVar36 = puVar37 + 0x10;
            lVar38 = lVar38 + lVar29;
            lVar35 = lVar35 + lVar29;
            lVar33 = lVar33 + lVar29;
            lVar25 = lVar25 + lVar29;
            uVar26 = _w & 0xfffffffc;
          }
          if ((int)uVar26 < (int)_w) {
            lVar27 = 0;
            do {
              *puVar36 = *(undefined4 *)((long)local_78.data + lVar27 * 4 + lVar38);
              puVar36[1] = *(undefined4 *)((long)local_78.data + lVar27 * 4 + lVar35);
              puVar36[2] = *(undefined4 *)((long)local_78.data + lVar27 * 4 + lVar33);
              puVar36[3] = *(undefined4 *)((long)local_78.data + lVar27 * 4 + lVar25);
              puVar36 = puVar36 + 4;
              lVar27 = lVar27 + 1;
            } while (_w - uVar26 != (int)lVar27);
          }
          uVar32 = uVar31 + 7;
          lVar34 = lVar34 + 1;
          lVar28 = lVar28 + 4;
          lVar30 = lVar30 + 4;
          local_c0 = local_c0 + 4;
          uVar31 = uVar31 + 4;
        } while (uVar32 < _h);
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      piVar4 = (this->super_InnerProduct).weight_data.refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->weight_data_tm).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar2 = (this->weight_data_tm).data;
          pAVar5 = (this->weight_data_tm).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar2,(long)iVar23 % (long)(int)_h & 0xffffffff);
          }
        }
      }
      piVar4 = (this->super_InnerProduct).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
      (this->weight_data_tm).refcount = piVar4;
      (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
      iVar23 = (this->super_InnerProduct).weight_data.w;
      iVar21 = (this->super_InnerProduct).weight_data.h;
      iVar22 = (this->super_InnerProduct).weight_data.d;
      (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
      (this->weight_data_tm).w = iVar23;
      (this->weight_data_tm).h = iVar21;
      (this->weight_data_tm).d = iVar22;
      (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
    }
    if (opt->lightmode == true) {
      piVar4 = (this->super_InnerProduct).weight_data.refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar2 = (this->super_InnerProduct).weight_data.data;
          pAVar5 = (this->super_InnerProduct).weight_data.allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar5->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_InnerProduct).weight_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
      (this->super_InnerProduct).weight_data.dims = 0;
      (this->super_InnerProduct).weight_data.w = 0;
      (this->super_InnerProduct).weight_data.h = 0;
      (this->super_InnerProduct).weight_data.d = 0;
      (this->super_InnerProduct).weight_data.c = 0;
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}